

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

DataAddress * __thiscall
Rml::DataModel::ResolveAddress
          (DataAddress *__return_storage_ptr__,DataModel *this,String *address_str,Element *element)

{
  DataAddressEntry *pDVar1;
  code *pcVar2;
  pointer k;
  DataAddress *pDVar3;
  DataAddress *pDVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  DataModel *pDVar9;
  NodePtr pDVar10;
  const_iterator cVar11;
  pointer pbVar12;
  char cVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  DataAddress local_d8;
  DataAddress *local_c0;
  DataAddress address;
  int index;
  StringList list;
  String local_50;
  
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = __return_storage_ptr__;
  StringUtilities::ExpandString(&list,address_str,'.');
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
            (&address,(long)list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  pbVar5 = list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar3 = local_c0;
  for (pbVar12 = list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar5; pbVar12 = pbVar12 + 1
      ) {
    if (pbVar12->_M_string_length == 0) {
LAB_00265a73:
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00265a80;
    }
    cVar13 = (char)pbVar12;
    lVar8 = ::std::__cxx11::string::find(cVar13,0x5b);
    if (lVar8 == 0) goto LAB_00265a73;
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar12);
    ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
    emplace_back<std::__cxx11::string>
              ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)&address,
               &local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    while (lVar8 != -1) {
      lVar8 = ::std::__cxx11::string::find(cVar13,0x5d);
      if (lVar8 == -1) goto LAB_00265a73;
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar12);
      iVar7 = FromString<int>(&local_50,-1);
      ::std::__cxx11::string::~string((string *)&local_50);
      index = iVar7;
      if (iVar7 < 0) goto LAB_00265a73;
      ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::emplace_back<int&>
                ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)&address,
                 &index);
      lVar8 = ::std::__cxx11::string::find(cVar13,0x5b);
    }
  }
  if (((address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) ||
      (local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_start =
            address.
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
            _M_impl.super__Vector_impl_data._M_start,
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish,
      ((address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start)->name)._M_string_length == 0)) &&
     (bVar6 = Assert("RMLUI_ASSERT(!address.empty() && !address[0].name.empty())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataModel.cpp"
                     ,0x49),
     local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
     _M_impl.super__Vector_impl_data._M_start =
          address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
          _M_impl.super__Vector_impl_data._M_start,
     local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
     _M_impl.super__Vector_impl_data._M_finish =
          address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish, !bVar6)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00265a80:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&address);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&list);
  k = local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start;
  if (local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (local_c0->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_c0->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    cVar14 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->variables,
                    &(local_d8.
                      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name);
    if (cVar14.mKeyVals == (NodePtr)(this->variables).mInfo) {
      while ((local_50._M_dataplus._M_p = (pointer)element, element != (Element *)0x0 &&
             (pDVar9 = Element::GetDataModel(element), pDVar9 == this))) {
        cVar15 = robin_hood::detail::
                 Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
                 ::find(&this->aliases,(key_type *)&local_50);
        pDVar10 = cVar15.mKeyVals;
        if ((pDVar10 != (NodePtr)(this->aliases).mInfo) &&
           (cVar11 = itlib::
                     flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                     ::find<std::__cxx11::string>
                               ((flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                                 *)&(pDVar10->mData).second,&k->name),
           cVar11._M_current !=
           (pDVar10->mData).second.m_container.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          pDVar1 = ((cVar11._M_current)->second).
                   super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar1 != ((cVar11._M_current)->second).
                         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish) &&
             ((pDVar1->name)._M_string_length != 0)) {
            DataAddressEntry::operator=
                      (local_d8.
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start,pDVar1);
            ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
            insert<__gnu_cxx::__normal_iterator<Rml::DataAddressEntry_const*,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,void>
                      ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)
                       &local_d8,
                       local_d8.
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       ((cVar11._M_current)->second).
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       ((cVar11._M_current)->second).
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            (local_c0->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_start =
                 local_d8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (local_c0->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_finish =
                 local_d8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (local_c0->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_d8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_c0 = &local_d8;
          }
          goto LAB_00265b75;
        }
        element = Element::GetParentNode((Element *)local_50._M_dataplus._M_p);
      }
      Log::Message(LT_WARNING,"Could not find variable name \'%s\' in data model.",
                   (address_str->_M_dataplus)._M_p);
LAB_00265b75:
      pDVar4 = local_c0;
      (local_c0->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar4->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar4->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00265b85;
    }
    (local_c0->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_c0->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  (local_c0->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00265b85:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&local_d8);
  return pDVar3;
}

Assistant:

DataAddress DataModel::ResolveAddress(const String& address_str, Element* element) const
{
	DataAddress address = ParseAddress(address_str);

	if (address.empty())
		return address;

	const String& first_name = address.front().name;

	auto it = variables.find(first_name);
	if (it != variables.end())
		return address;

	// Look for a variable alias for the first name.

	Element* ancestor = element;
	while (ancestor && ancestor->GetDataModel() == this)
	{
		auto it_element = aliases.find(ancestor);
		if (it_element != aliases.end())
		{
			const auto& alias_names = it_element->second;
			auto it_alias_name = alias_names.find(first_name);
			if (it_alias_name != alias_names.end())
			{
				const DataAddress& replace_address = it_alias_name->second;
				if (replace_address.empty() || replace_address.front().name.empty())
				{
					// Variable alias is invalid
					return DataAddress();
				}

				// Insert the full alias address, replacing the first element.
				address[0] = replace_address[0];
				address.insert(address.begin() + 1, replace_address.begin() + 1, replace_address.end());
				return address;
			}
		}

		ancestor = ancestor->GetParentNode();
	}

	Log::Message(Log::LT_WARNING, "Could not find variable name '%s' in data model.", address_str.c_str());

	return DataAddress();
}